

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O3

int mbedtls_asn1_write_len(uchar **p,uchar *start,size_t len)

{
  int iVar1;
  uchar *puVar2;
  uchar uVar3;
  
  uVar3 = (uchar)len;
  if (len < 0x80) {
    puVar2 = *p;
    if (puVar2 == start || (long)puVar2 - (long)start < 0) {
      return -0x6c;
    }
    iVar1 = 1;
  }
  else {
    puVar2 = *p;
    if (len < 0x100) {
      if ((long)puVar2 - (long)start < 2) {
        return -0x6c;
      }
      *p = puVar2 + -1;
      puVar2[-1] = uVar3;
      puVar2 = *p;
      iVar1 = 2;
      uVar3 = 0x81;
    }
    else {
      if ((long)puVar2 - (long)start < 3) {
        return -0x6c;
      }
      *p = puVar2 + -1;
      puVar2[-1] = uVar3;
      puVar2 = *p;
      *p = puVar2 + -1;
      puVar2[-1] = (uchar)(len >> 8);
      puVar2 = *p;
      iVar1 = 3;
      uVar3 = 0x82;
    }
  }
  *p = puVar2 + -1;
  puVar2[-1] = uVar3;
  return iVar1;
}

Assistant:

int mbedtls_asn1_write_len( unsigned char **p, unsigned char *start, size_t len )
{
    if( len < 0x80 )
    {
        if( *p - start < 1 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = (unsigned char) len;
        return( 1 );
    }

    if( len <= 0xFF )
    {
        if( *p - start < 2 )
            return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

        *--(*p) = (unsigned char) len;
        *--(*p) = 0x81;
        return( 2 );
    }

    if( *p - start < 3 )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    // We assume we never have lengths larger than 65535 bytes
    //
    *--(*p) = len % 256;
    *--(*p) = ( len / 256 ) % 256;
    *--(*p) = 0x82;

    return( 3 );
}